

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSplineLoader.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL::SplineLoader::begin__input____InputLocal
          (SplineLoader *this,input____InputLocal__AttributeData *attributeData)

{
  InputUnshared *this_00;
  allocator<char> local_5a;
  allocator<char> local_59;
  String local_58;
  String local_38;
  
  this_00 = (InputUnshared *)operator_new(0xf8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,attributeData->semantic,&local_59);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,attributeData->source,&local_5a);
  InputUnshared::InputUnshared(this_00,&local_38,&local_58);
  this->mCurrentVertexInput = this_00;
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return true;
}

Assistant:

bool SplineLoader::begin__input____InputLocal( const input____InputLocal__AttributeData& attributeData )
	{
		mCurrentVertexInput = new InputUnshared(attributeData.semantic, attributeData.source);
		return true;
	}